

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_comment(xml_buffered_writer *writer,char_t *s)

{
  uint uVar1;
  xml_buffered_writer *in_RSI;
  xml_buffered_writer *in_RDI;
  char_t *prev;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  byte bVar2;
  xml_buffered_writer *this;
  xml_buffered_writer *__n;
  
  xml_buffered_writer::write(in_RDI,0x3c,(void *)0x21,0x2d);
  while (this = in_RSI, in_RSI->buffer[0] != '\0') {
    while( true ) {
      bVar2 = 0;
      __n = this;
      if (this->buffer[0] != '\0') {
        uVar1 = (uint)this->buffer[0];
        in_stack_ffffffffffffffe6 = false;
        if (uVar1 == 0x2d) {
          uVar1 = (uint)this->buffer[1];
          in_stack_ffffffffffffffe5 = true;
          in_stack_ffffffffffffffe6 = in_stack_ffffffffffffffe5;
          if (uVar1 != 0x2d) {
            in_stack_ffffffffffffffe5 = this->buffer[1] == '\0';
            in_stack_ffffffffffffffe6 = in_stack_ffffffffffffffe5;
          }
        }
        __n = (xml_buffered_writer *)(ulong)uVar1;
        bVar2 = in_stack_ffffffffffffffe6 ^ 0xff;
      }
      if ((bVar2 & 1) == 0) break;
      this = (xml_buffered_writer *)(this->buffer + 1);
    }
    xml_buffered_writer::write_buffer
              (this,in_RSI->buffer,
               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffe6,
                                       CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0)
                                      )));
    in_RSI = this;
    if (this->buffer[0] != '\0') {
      xml_buffered_writer::write(in_RDI,0x2d,(void *)0x20,(size_t)__n);
      in_RSI = (xml_buffered_writer *)(this->buffer + 1);
    }
  }
  xml_buffered_writer::write(in_RDI,0x2d,(void *)0x2d,0x3e);
  return;
}

Assistant:

PUGI__FN void node_output_comment(xml_buffered_writer& writer, const char_t* s)
	{
		writer.write('<', '!', '-', '-');

		while (*s)
		{
			const char_t* prev = s;

			// look for -\0 or -- sequence - we can't output it since -- is illegal in comment body
			while (*s && !(s[0] == '-' && (s[1] == '-' || s[1] == 0))) ++s;

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			if (*s)
			{
				assert(*s == '-');

				writer.write('-', ' ');
				++s;
			}
		}

		writer.write('-', '-', '>');
	}